

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_ge_jacobian_test(secp256k1_gej *gej,secp256k1_ge *ge)

{
  secp256k1_fe *fe;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe sStack_88;
  secp256k1_fe local_58;
  
  fe = &gej->z;
  testutil_random_fe_non_zero_test(fe);
  secp256k1_fe_sqr(&local_58,fe);
  secp256k1_fe_mul(&sStack_88,&local_58,fe);
  secp256k1_fe_mul(&gej->x,&ge->x,&local_58);
  secp256k1_fe_mul(&gej->y,&ge->y,&sStack_88);
  gej->infinity = ge->infinity;
  return;
}

Assistant:

static void testutil_random_ge_jacobian_test(secp256k1_gej *gej, const secp256k1_ge *ge) {
    secp256k1_fe z2, z3;
    testutil_random_fe_non_zero_test(&gej->z);
    secp256k1_fe_sqr(&z2, &gej->z);
    secp256k1_fe_mul(&z3, &z2, &gej->z);
    secp256k1_fe_mul(&gej->x, &ge->x, &z2);
    secp256k1_fe_mul(&gej->y, &ge->y, &z3);
    gej->infinity = ge->infinity;
}